

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_allocator.hpp
# Opt level: O1

JsonValue * __thiscall
MercuryJson::BlockAllocator<MercuryJson::JsonValue>::
construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>
          (BlockAllocator<MercuryJson::JsonValue> *this,JsonObject *args)

{
  pointer *pppcVar1;
  BlockAllocator<MercuryJson::JsonValue> *pBVar2;
  JsonValue *pJVar3;
  int iVar4;
  iterator __position;
  vector<char*,std::allocator<char*>> *this_00;
  char *pcVar5;
  void *p;
  char *local_20;
  
  if (this->block_size < this->allocated + 0x10) {
    this->allocated = 0;
    iVar4 = posix_memalign(&local_20,0x10,this->block_size + 0xf & 0xfffffffffffffff0);
    pcVar5 = (char *)0x0;
    if (iVar4 == 0) {
      pcVar5 = local_20;
    }
    this->ptr = pcVar5;
    pBVar2 = this->parent;
    if (pBVar2 == (BlockAllocator<MercuryJson::JsonValue> *)0x0) {
      __position._M_current =
           (this->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = pcVar5;
        pppcVar1 = &(this->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
        goto LAB_0010f017;
      }
      this_00 = (vector<char*,std::allocator<char*>> *)&this->all_memory;
    }
    else {
      __position._M_current =
           (pBVar2->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (pBVar2->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = pcVar5;
        pppcVar1 = &(pBVar2->all_memory).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
        goto LAB_0010f017;
      }
      this_00 = (vector<char*,std::allocator<char*>> *)&pBVar2->all_memory;
    }
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
              (this_00,__position,&this->ptr);
  }
LAB_0010f017:
  pJVar3 = (JsonValue *)this->ptr;
  pJVar3->type = TYPE_OBJ;
  (pJVar3->field_1).object = args;
  this->ptr = this->ptr + 0x10;
  this->allocated = this->allocated + 0x10;
  return pJVar3;
}

Assistant:

T *construct(Args ...args) {
            check_alloc(sizeof(T));
            static constexpr size_t size = round_up(sizeof(T), kAlignment);
            T *ret = new(ptr) T(std::forward<Args>(args)...);
            ptr += size;
            allocated += size;
            return ret;
        }